

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int vector_add_pos(uint32_t i,void *element,vector *vector)

{
  bool bVar1;
  uint32_t local_34;
  uint local_2c;
  void **ppvStack_28;
  uint32_t j;
  void **data;
  vector *vector_local;
  void *element_local;
  uint32_t i_local;
  
  ppvStack_28 = vector->data;
  if (ppvStack_28 == (void **)0x0) {
    if (vector->size == 0) {
      vector->size = 0x80;
    }
    ppvStack_28 = (void **)(*mixed_calloc)((size_t)vector->size,8);
    vector->count = 0;
  }
  while( true ) {
    bVar1 = false;
    if (ppvStack_28 != (void **)0x0) {
      bVar1 = vector->size <= i;
    }
    if (!bVar1) break;
    ppvStack_28 = (void **)crealloc(vector->data,(ulong)vector->size,(ulong)(vector->size << 1),8);
    if (ppvStack_28 != (void **)0x0) {
      vector->size = vector->size << 1;
    }
  }
  if (ppvStack_28 == (void **)0x0) {
    mixed_err(1);
    element_local._4_4_ = 0;
  }
  else {
    for (local_2c = vector->count + 1; i < local_2c; local_2c = local_2c - 1) {
      ppvStack_28[local_2c] = ppvStack_28[local_2c - 1];
    }
    ppvStack_28[i] = element;
    vector->data = ppvStack_28;
    local_34 = i;
    if (i <= vector->count) {
      local_34 = vector->count + 1;
    }
    vector->count = local_34;
    element_local._4_4_ = 1;
  }
  return element_local._4_4_;
}

Assistant:

int vector_add_pos(uint32_t i, void *element, struct vector *vector){
  void **data = vector->data;
  // Not yet initialised
  if(!data){
    if(vector->size == 0) vector->size = BASE_VECTOR_SIZE;
    data = mixed_calloc(vector->size, sizeof(void *));
    vector->count = 0;
  }
  // Too small
  while(data && vector->size <= i){
    data = crealloc(vector->data, vector->size, vector->size*2, sizeof(void *));
    if(data) vector->size *= 2;
  }
  // Check completeness
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }
  // Shift
  for(uint32_t j=vector->count+1; i<j; --j){
    data[j] = data[j-1];
  }
  data[i] = element;
  vector->data = data;
  vector->count = (vector->count < i)? i : vector->count+1;
  return 1;
}